

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tables.c
# Opt level: O0

void dump_value(int indent,amqp_field_value_t v,FILE *out)

{
  long lVar1;
  FILE *in_RSI;
  char *__s;
  byte bVar2;
  amqp_field_value_t in_stack_00000000;
  long in_stack_00000018;
  int i;
  FILE *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar5;
  float fVar3;
  ulong uVar4;
  
  dump_indent((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),in_stack_ffffffffffffffb8);
  fputc((uint)in_stack_00000000.value._0_1_,in_RSI);
  bVar2 = in_stack_00000000.value._8_1_;
  fVar3 = in_stack_00000000.value._8_4_;
  uVar4 = in_stack_00000000.value._8_8_;
  switch(in_stack_00000000.value._0_1_) {
  case 'A':
    fputc(10,in_RSI);
    for (iVar5 = 0; iVar5 < in_stack_00000000.value._8_4_; iVar5 = iVar5 + 1) {
      dump_value((int)((ulong)in_RSI >> 0x20),in_stack_00000000,
                 (FILE *)CONCAT44(iVar5,in_stack_ffffffffffffffe8));
    }
    break;
  case 'B':
    fprintf(in_RSI," %u\n",(ulong)bVar2);
    break;
  default:
    fprintf(in_RSI,"???\n");
    break;
  case 'D':
    fprintf(in_RSI," %d:::%u\n",(ulong)bVar2,(ulong)in_stack_00000000.value._12_4_);
    break;
  case 'F':
    fputc(10,in_RSI);
    for (iVar5 = 0; iVar5 < in_stack_00000000.value._8_4_; iVar5 = iVar5 + 1) {
      dump_indent((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),in_stack_ffffffffffffffb8);
      fprintf(in_RSI,"%.*s ->\n",*(ulong *)(in_stack_00000018 + (long)iVar5 * 0x28) & 0xffffffff,
              *(undefined8 *)(in_stack_00000018 + (long)iVar5 * 0x28 + 8));
      lVar1 = in_stack_00000018 + (long)iVar5 * 0x28;
      in_stack_ffffffffffffffb8 = *(FILE **)(lVar1 + 0x10);
      in_stack_ffffffffffffffc0 = *(undefined8 *)(lVar1 + 0x18);
      dump_value((int)((ulong)in_RSI >> 0x20),in_stack_00000000,
                 (FILE *)CONCAT44(iVar5,in_stack_ffffffffffffffe8));
    }
    break;
  case 'I':
    fprintf(in_RSI," %d\n",(ulong)(uint)fVar3);
    break;
  case 'S':
    fprintf(in_RSI," %.*s\n",uVar4 & 0xffffffff,in_stack_00000018);
    break;
  case 'T':
    fprintf(in_RSI," %lu\n",uVar4);
    break;
  case 'V':
    fputc(10,in_RSI);
    break;
  case 'b':
    fprintf(in_RSI," %d\n",(ulong)(uint)(int)(char)bVar2);
    break;
  case 'd':
    fprintf(in_RSI," %g\n",uVar4);
    break;
  case 'f':
    fprintf(in_RSI," %g\n",(double)fVar3);
    break;
  case 'i':
    fprintf(in_RSI," %u\n",(ulong)(uint)fVar3);
    break;
  case 'l':
    fprintf(in_RSI," %ld\n",uVar4);
    break;
  case 's':
    fprintf(in_RSI," %d\n",(ulong)(uint)(int)(short)in_stack_00000000.value._8_2_);
    break;
  case 't':
    __s = " false\n";
    if (fVar3 != 0.0) {
      __s = " true\n";
    }
    fputs(__s,in_RSI);
    break;
  case 'u':
    fprintf(in_RSI," %u\n",(ulong)in_stack_00000000.value._8_2_);
    break;
  case 'x':
    fputc(0x20,in_RSI);
    for (iVar5 = 0; iVar5 < in_stack_00000000.value._8_4_; iVar5 = iVar5 + 1) {
      fprintf(in_RSI,"%02x",(ulong)(uint)(int)*(char *)(in_stack_00000018 + iVar5));
    }
    fputc(10,in_RSI);
  }
  return;
}

Assistant:

static void dump_value(int indent, amqp_field_value_t v, FILE *out)
{
  int i;

  dump_indent(indent, out);
  fputc(v.kind, out);

  switch (v.kind) {
  case AMQP_FIELD_KIND_BOOLEAN:
    fputs(v.value.boolean ? " true\n" : " false\n", out);
    break;

  case AMQP_FIELD_KIND_I8:
    fprintf(out, " %"PRId8"\n", v.value.i8);
    break;

  case AMQP_FIELD_KIND_U8:
    fprintf(out, " %"PRIu8"\n", v.value.u8);
    break;

  case AMQP_FIELD_KIND_I16:
    fprintf(out, " %"PRId16"\n", v.value.i16);
    break;

  case AMQP_FIELD_KIND_U16:
    fprintf(out, " %"PRIu16"\n", v.value.u16);
    break;

  case AMQP_FIELD_KIND_I32:
    fprintf(out, " %"PRId32"\n", v.value.i32);
    break;

  case AMQP_FIELD_KIND_U32:
    fprintf(out, " %"PRIu32"\n", v.value.u32);
    break;

  case AMQP_FIELD_KIND_I64:
    fprintf(out, " %"PRId64"\n", v.value.i64);
    break;

  case AMQP_FIELD_KIND_F32:
    fprintf(out, " %g\n", (double) v.value.f32);
    break;

  case AMQP_FIELD_KIND_F64:
    fprintf(out, " %g\n", v.value.f64);
    break;

  case AMQP_FIELD_KIND_DECIMAL:
    fprintf(out, " %d:::%u\n", v.value.decimal.decimals,
            v.value.decimal.value);
    break;

  case AMQP_FIELD_KIND_UTF8:
    fprintf(out, " %.*s\n", (int)v.value.bytes.len,
            (char *)v.value.bytes.bytes);
    break;

  case AMQP_FIELD_KIND_BYTES:
    fputc(' ', out);
    for (i = 0; i < (int)v.value.bytes.len; i++) {
      fprintf(out, "%02x", ((char *) v.value.bytes.bytes)[i]);
    }

    fputc('\n', out);
    break;

  case AMQP_FIELD_KIND_ARRAY:
    fputc('\n', out);
    for (i = 0; i < v.value.array.num_entries; i++) {
      dump_value(indent + 2, v.value.array.entries[i], out);
    }

    break;

  case AMQP_FIELD_KIND_TIMESTAMP:
    fprintf(out, " %"PRIu64"\n", v.value.u64);
    break;

  case AMQP_FIELD_KIND_TABLE:
    fputc('\n', out);
    for (i = 0; i < v.value.table.num_entries; i++) {
      dump_indent(indent + 2, out);
      fprintf(out, "%.*s ->\n",
              (int)v.value.table.entries[i].key.len,
              (char *)v.value.table.entries[i].key.bytes);
      dump_value(indent + 4, v.value.table.entries[i].value, out);
    }

    break;

  case AMQP_FIELD_KIND_VOID:
    fputc('\n', out);
    break;

  default:
    fprintf(out, "???\n");
    break;
  }
}